

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::WaiterList_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<unsigned_int>
          (BaseDictionary<unsigned_int,_Js::WaiterList_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uint *key,WaiterList **value)

{
  Type piVar1;
  uint uVar2;
  Type this_00;
  uint uVar3;
  
  piVar1 = this->buckets;
  uVar2 = 0;
  if (piVar1 != (Type)0x0) {
    uVar2 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar3 = piVar1[uVar2];
    uVar2 = 0;
    if (-1 < (int)uVar3) {
      uVar2 = 0;
      do {
        if (this->entries[uVar3].
            super_DefaultHashedEntry<unsigned_int,_Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_int,_Js::WaiterList_*>.
            super_ValueEntry<Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>_>
            .super_KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>.key == *key) {
          this_00 = this->stats;
          goto LAB_00d5cd3f;
        }
        uVar2 = uVar2 + 1;
        uVar3 = this->entries[uVar3].
                super_DefaultHashedEntry<unsigned_int,_Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_Js::WaiterList_*>.
                super_ValueEntry<Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>_>
                .super_KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>.next;
      } while (-1 < (int)uVar3);
    }
  }
  this_00 = this->stats;
  uVar3 = 0xffffffff;
LAB_00d5cd3f:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar2);
  }
  if (-1 < (int)uVar3) {
    *value = this->entries[uVar3].
             super_DefaultHashedEntry<unsigned_int,_Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<unsigned_int,_Js::WaiterList_*>.
             super_ValueEntry<Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>_>
             .super_KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>.value;
  }
  return -1 < (int)uVar3;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }